

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::FuncArgsContext::markScratchRegs(FuncArgsContext *this,FuncFrame *frame)

{
  uint uVar1;
  WorkData *pWVar2;
  Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL> *in_RDI;
  RegMask regMask;
  RegMask regs;
  RegMask workRegs;
  WorkData *wd;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  uint32_t groupMask;
  undefined7 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  uint local_d0;
  byte local_bb;
  byte local_ba;
  undefined1 local_b9;
  undefined1 *local_b8;
  undefined1 local_ad;
  uint local_ac;
  undefined1 *local_90;
  undefined1 local_81;
  undefined1 *local_80;
  undefined1 local_71;
  byte *local_70;
  byte *local_68;
  byte *local_60;
  byte *local_58;
  WorkData *local_50;
  undefined1 *local_48;
  WorkData *local_40;
  WorkData *local_38;
  WorkData *local_30;
  byte local_25;
  uint local_24;
  uint local_20;
  uint local_1c;
  undefined1 *local_18;
  byte *local_10;
  uint *local_8;
  
  local_ad = 0;
  local_48 = &local_ad;
  local_ac = (byte)in_RDI->_data[0]._dstShuf & 0xfffffffe |
             (uint)*(byte *)((long)&in_RDI->_data[0]._dstRegs + 3);
  if (local_ac != 0) {
    local_b8 = &local_b9;
    local_81 = 0;
    local_ba = 0;
    local_71 = 4;
    local_bb = 4;
    local_90 = local_b8;
    local_80 = local_b8;
    local_18 = local_48;
    while( true ) {
      local_68 = &local_ba;
      local_70 = &local_bb;
      if (local_ba == local_bb) break;
      local_60 = &local_ba;
      local_25 = local_ba;
      local_24 = local_ac;
      local_10 = &local_25;
      if (((local_ac & 1 << (local_ba & 0x1f)) != 0) &&
         (pWVar2 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                   operator[]<asmjit::v1_14::RegGroup>
                             (in_RDI,(RegGroup *)CONCAT17(local_ba,in_stack_ffffffffffffff18)),
         pWVar2->_needsScratch != '\0')) {
        uVar1 = pWVar2->_workRegs;
        local_d0 = uVar1 & ((pWVar2->_usedRegs | pWVar2->_dstShuf) ^ 0xffffffff);
        if (local_d0 == 0) {
          local_d0 = uVar1 & (pWVar2->_usedRegs ^ 0xffffffff);
          local_38 = pWVar2;
        }
        if (local_d0 == 0) {
          local_d0 = pWVar2->_archRegs & (uVar1 ^ 0xffffffff);
          local_50 = pWVar2;
        }
        local_40 = pWVar2;
        local_30 = pWVar2;
        if (local_d0 != 0) {
          local_1c = local_d0;
          local_20 = local_d0;
          local_8 = &local_20;
          pWVar2->_workRegs = local_d0 & -local_d0 | pWVar2->_workRegs;
          FuncFrame::addDirtyRegs
                    ((FuncFrame *)CONCAT44(local_d0 & -local_d0,in_stack_ffffffffffffff28),
                     (RegGroup)((ulong)in_RDI >> 0x38),(RegMask)in_RDI);
        }
      }
      local_58 = &local_ba;
      local_ba = local_ba + 1;
    }
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsContext::markScratchRegs(FuncFrame& frame) noexcept {
  uint32_t groupMask = 0;

  // Handle stack to stack moves.
  groupMask |= _stackDstMask;

  // Handle register swaps.
  groupMask |= _regSwapsMask & ~Support::bitMask(RegGroup::kGp);

  if (!groupMask)
    return kErrorOk;

  // Selects one dirty register per affected group that can be used as a scratch register.
  for (RegGroup group : RegGroupVirtValues{}) {
    if (Support::bitTest(groupMask, group)) {
      WorkData& wd = _workData[group];
      if (wd._needsScratch) {
        // Initially, pick some clobbered or dirty register.
        RegMask workRegs = wd.workRegs();
        RegMask regs = workRegs & ~(wd.usedRegs() | wd._dstShuf);

        // If that didn't work out pick some register which is not in 'used'.
        if (!regs) {
          regs = workRegs & ~wd.usedRegs();
        }

        // If that didn't work out pick any other register that is allocable.
        // This last resort case will, however, result in marking one more
        // register dirty.
        if (!regs) {
          regs = wd.archRegs() & ~workRegs;
        }

        // If that didn't work out we will have to use XORs instead of MOVs.
        if (!regs) {
          continue;
        }

        RegMask regMask = Support::blsi(regs);
        wd._workRegs |= regMask;
        frame.addDirtyRegs(group, regMask);
      }
    }
  }

  return kErrorOk;
}